

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QByteArray * QSysInfo::bootUniqueId(void)

{
  long lVar1;
  int iVar2;
  qint64 qVar3;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qint64 len;
  int fd;
  char uuid [36];
  mode_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QByteArray *data;
  undefined8 in_stack_ffffffffffffffb0;
  int fd_00;
  QByteArray *size;
  char *in_stack_ffffffffffffffc8;
  QByteArray *in_stack_ffffffffffffffd0;
  
  fd_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  size = in_RDI;
  iVar2 = qt_safe_open((char *)in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  if (iVar2 != -1) {
    memset(&stack0xffffffffffffffc8,0xaa,0x24);
    qVar3 = qt_safe_read(fd_00,data,(qint64)in_RDI);
    qt_safe_close((int)((ulong)in_RDI >> 0x20));
    if (qVar3 == 0x24) {
      QByteArray::QByteArray(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(qsizetype)size);
      goto LAB_0025b5f5;
    }
  }
  QByteArray::QByteArray((QByteArray *)0x25b5f5);
LAB_0025b5f5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return data;
}

Assistant:

QByteArray QSysInfo::bootUniqueId()
{
#ifdef Q_OS_LINUX
    // use low-level API here for simplicity
    int fd = qt_safe_open("/proc/sys/kernel/random/boot_id", O_RDONLY);
    if (fd != -1) {
        char uuid[UuidStringLen];
        qint64 len = qt_safe_read(fd, uuid, sizeof(uuid));
        qt_safe_close(fd);
        if (len == UuidStringLen)
            return QByteArray(uuid, UuidStringLen);
    }
#elif defined(Q_OS_DARWIN)
    // "kern.bootsessionuuid" is only available by name
    char uuid[UuidStringLen + 1];
    size_t uuidlen = sizeof(uuid);
    if (sysctlbyname("kern.bootsessionuuid", uuid, &uuidlen, nullptr, 0) == 0
            && uuidlen == sizeof(uuid))
        return QByteArray(uuid, uuidlen - 1);
#endif
    return QByteArray();
}